

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall
cmComputeLinkDepends::HandleSharedDependency(cmComputeLinkDepends *this,SharedDepEntry *dep)

{
  bool bVar1;
  pointer ppVar2;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *this_00;
  cmLinkInterface *iface_00;
  cmLinkInterface *iface;
  reference local_48;
  LinkEntry *entry;
  reference pvStack_38;
  int index;
  LinkEntry *entry_1;
  _Self local_28;
  _Self local_20;
  iterator lei;
  SharedDepEntry *dep_local;
  cmComputeLinkDepends *this_local;
  
  lei._M_node = (_Base_ptr)dep;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find(&this->LinkEntryIndex,(key_type *)dep);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::end(&this->LinkEntryIndex);
  bVar1 = std::operator==(&local_20,&local_28);
  if (bVar1) {
    entry_1 = (LinkEntry *)AllocateLinkEntry(this,(string *)lei._M_node);
    local_20._M_node = (_Base_ptr)entry_1;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
             ::operator->(&local_20);
    pvStack_38 = std::
                 vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                 ::operator[](&this->EntryList,(long)ppVar2->second);
    std::__cxx11::string::operator=((string *)pvStack_38,(string *)lei._M_node);
    pvStack_38->Target = *(cmGeneratorTarget **)(lei._M_node + 1);
    pvStack_38->IsSharedDep = true;
  }
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
           ::operator->(&local_20);
  entry._4_4_ = ppVar2->second;
  local_48 = std::
             vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
             ::operator[](&this->EntryList,(long)entry._4_4_);
  this_00 = &std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                       (&(this->EntryConstraintGraph).
                         super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                        (long)*(int *)&lei._M_node[1]._M_parent)->
             super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
  cmGraphEdge::cmGraphEdge((cmGraphEdge *)&iface,entry._4_4_,true);
  std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::push_back(this_00,(value_type *)&iface);
  if ((local_48->Target != (cmGeneratorTarget *)0x0) &&
     (iface_00 = cmGeneratorTarget::GetLinkInterface(local_48->Target,&this->Config,this->Target),
     iface_00 != (cmLinkInterface *)0x0)) {
    FollowSharedDeps(this,entry._4_4_,iface_00,true);
  }
  return;
}

Assistant:

void cmComputeLinkDepends::HandleSharedDependency(SharedDepEntry const& dep)
{
  // Check if the target already has an entry.
  std::map<std::string, int>::iterator lei =
    this->LinkEntryIndex.find(dep.Item);
  if (lei == this->LinkEntryIndex.end()) {
    // Allocate a spot for the item entry.
    lei = this->AllocateLinkEntry(dep.Item);

    // Initialize the item entry.
    LinkEntry& entry = this->EntryList[lei->second];
    entry.Item = dep.Item;
    entry.Target = dep.Item.Target;

    // This item was added specifically because it is a dependent
    // shared library.  It may get special treatment
    // in cmComputeLinkInformation.
    entry.IsSharedDep = true;
  }

  // Get the link entry for this target.
  int index = lei->second;
  LinkEntry& entry = this->EntryList[index];

  // This shared library dependency must follow the item that listed
  // it.
  this->EntryConstraintGraph[dep.DependerIndex].push_back(index);

  // Target items may have their own dependencies.
  if (entry.Target) {
    if (cmLinkInterface const* iface =
          entry.Target->GetLinkInterface(this->Config, this->Target)) {
      // Follow public and private dependencies transitively.
      this->FollowSharedDeps(index, iface, true);
    }
  }
}